

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gui.cpp
# Opt level: O2

void GUIRender(HGUI handle)

{
  byte bVar1;
  mu_Color mVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined8 uVar5;
  undefined8 uVar6;
  byte bVar9;
  int iVar10;
  long lVar11;
  char *p;
  mu_Color *pmVar12;
  mu_Vec2 mVar13;
  mu_Rect mVar14;
  mu_Rect src;
  mu_Rect src_00;
  mu_Command *cmd;
  double y;
  double x;
  
  glfwGetCursorPos(*(GLFWwindow **)((long)handle + 0x18),&x,&y);
  mu_input_mousemove(*(mu_Context **)((long)handle + 0x10),(int)x,(int)y);
  *(ulong *)((long)handle + 0x1a0ca0) = CONCAT44((int)y,(int)x);
  cmd = (mu_Command *)0x0;
  while (iVar10 = mu_next_command(*(mu_Context **)((long)handle + 0x10),&cmd), iVar10 != 0) {
    switch(cmd->type) {
    case 2:
      uVar3 = ((mu_Rect *)((long)cmd + 8))->x;
      uVar7 = ((mu_Rect *)((long)cmd + 8))->y;
      mVar13 = (cmd->text).pos;
      Render((GUI *)handle);
      (*glad_glEnable)(0xc11);
      iVar10 = mVar13.y;
      (*glad_glScissor)(uVar3,*(int *)((long)handle + 0x1a0c9c) - (uVar7 + iVar10),mVar13.x,iVar10);
      break;
    case 3:
      PushQuad((GUI *)handle,(cmd->clip).rect,*(mu_Rect *)((long)handle + 0x1a0070),
               (cmd->rect).color);
      break;
    case 4:
      mVar13 = (cmd->text).pos;
      mVar2 = (cmd->rect).color;
      for (pmVar12 = &(cmd->icon).color; bVar1 = pmVar12->r, bVar1 != 0;
          pmVar12 = (mu_Color *)&pmVar12->g) {
        bVar9 = bVar1 + 6;
        if (0x7e < bVar1) {
          bVar9 = 0x85;
        }
        uVar5 = *(undefined8 *)((long)handle + (ulong)bVar9 * 0x10 + 0x1a0028);
        mVar14.w = (int)uVar5;
        mVar14.h = (int)((ulong)uVar5 >> 0x20);
        mVar14.x = mVar13.x;
        mVar14.y = mVar13.y;
        src.w = (int)uVar5;
        src.h = (int)((ulong)uVar5 >> 0x20);
        src._0_8_ = *(undefined8 *)((long)handle + (ulong)bVar9 * 0x10 + 0x1a0020);
        PushQuad((GUI *)handle,mVar14,src,mVar2);
        mVar13 = (mu_Vec2)((ulong)mVar13 & 0xffffffff00000000 | (ulong)(uint)(mVar13.x + (int)uVar5)
                          );
      }
      break;
    case 5:
      uVar4 = ((mu_Rect *)((long)cmd + 8))->x;
      uVar8 = ((mu_Rect *)((long)cmd + 8))->y;
      mVar2 = (cmd->icon).color;
      lVar11 = (long)(cmd->icon).id * 0x10;
      uVar5 = *(undefined8 *)((long)handle + lVar11 + 0x1a0020);
      uVar6 = *(undefined8 *)((long)handle + lVar11 + 0x1a0028);
      iVar10 = (int)((ulong)uVar6 >> 0x20);
      mVar14 = mu_rect(uVar4 + ((cmd->text).pos.x - (int)uVar6) / 2,
                       uVar8 + ((cmd->text).pos.y - iVar10) / 2,(int)uVar6,iVar10);
      src_00.w = (int)uVar6;
      src_00.h = (int)((ulong)uVar6 >> 0x20);
      src_00._0_8_ = uVar5;
      PushQuad((GUI *)handle,mVar14,src_00,mVar2);
    }
  }
  Render((GUI *)handle);
  return;
}

Assistant:

void GUIRender(HGUI handle) {
    GUI* gui = (GUI*)handle;
    GLFWwindow* window = gui->Window;

    double x, y;
    glfwGetCursorPos(window, &x, &y);
    mu_input_mousemove(gui->Ctx, x, y);
    gui->CursorX = x;
    gui->CursorY = y;

    mu_Command *cmd = NULL;
    while (mu_next_command(gui->Ctx, &cmd)) {
        switch (cmd->type) {
            case MU_COMMAND_TEXT: DrawText(gui, cmd->text.str, cmd->text.pos, cmd->text.color); break;
            case MU_COMMAND_RECT: DrawRect(gui, cmd->rect.rect, cmd->rect.color); break;
            case MU_COMMAND_ICON: DrawIcon(gui, cmd->icon.id, cmd->icon.rect, cmd->icon.color); break;
            case MU_COMMAND_CLIP: ClipRect(gui, cmd->clip.rect); break;
        }
    }

    Render(gui);
}